

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,Interval *iarg0)

{
  double dVar1;
  Interval *pIVar2;
  Interval **ppIVar3;
  undefined8 uVar4;
  double *pdVar5;
  undefined8 *puVar6;
  double this_00;
  bool bVar7;
  deBool dVar8;
  float fVar9;
  Interval local_280;
  Interval local_268;
  Interval local_250;
  Interval local_238;
  Interval local_220;
  Interval *local_208;
  double local_200;
  double local_1f8;
  Interval local_1f0;
  Interval *local_1d8;
  Interval *pIStack_1d0;
  Interval *local_1c8;
  Interval **local_1c0;
  Interval *point_3;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  double *local_1a0;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_158;
  ScopedRoundingMode point_ctx__1;
  Interval *val_1;
  double arg0_1;
  double local_140;
  double local_138;
  Interval *local_130;
  Interval *pIStack_128;
  Interval *local_120;
  Interval **local_118;
  Interval *point_1;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 *local_f8;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_c8 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_a0;
  ScopedRoundingMode point_ctx_;
  Interval *val;
  double arg0;
  double local_88;
  double local_80;
  undefined1 local_78 [8];
  Interval val_hi_;
  Interval val_lo_;
  Interval *val_dst_;
  Interval *val_arg_;
  Interval ret;
  Interval *iarg0_local;
  EvalContext *ctx_local;
  FloatFunc1 *this_local;
  
  ret.m_hi = (double)iarg0;
  tcu::Interval::Interval((Interval *)&val_arg_);
  do {
    this_00 = ret.m_hi;
    tcu::Interval::Interval((Interval *)&val_hi_.m_hi);
    tcu::Interval::Interval((Interval *)local_78);
    bVar7 = tcu::Interval::empty((Interval *)this_00);
    if (bVar7) {
      tcu::Interval::Interval((Interval *)&arg0);
      val_arg_ = (Interval *)arg0;
      ret._0_8_ = local_88;
      ret.m_lo = local_80;
    }
    else {
      dVar1 = tcu::Interval::lo((Interval *)this_00);
      pdStack_a0 = &val_hi_.m_hi;
      do {
        tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
        point_lo_.m_hi = (double)pdStack_a0;
        tcu::Interval::Interval((Interval *)auStack_c8);
        tcu::Interval::Interval((Interval *)&point);
        local_f8 = (undefined8 *)auStack_c8;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (*(this->
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ).
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xc])(SUB84(dVar1,0),&point_1,this,ctx);
        puVar6 = local_f8;
        local_f8[2] = local_100;
        uVar4 = uStack_108;
        *puVar6 = point_1;
        puVar6[1] = uVar4;
        local_118 = &point;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (*(this->
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ).
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xc])(SUB84(dVar1,0),&local_130,this,ctx);
        ppIVar3 = local_118;
        local_118[2] = local_120;
        pIVar2 = pIStack_128;
        *ppIVar3 = local_130;
        ppIVar3[1] = pIVar2;
        tcu::Interval::operator|((Interval *)&arg0_1,(Interval *)auStack_c8,(Interval *)&point);
        *(double *)point_lo_.m_hi = arg0_1;
        *(double *)((long)point_lo_.m_hi + 8) = local_140;
        *(double *)((long)point_lo_.m_hi + 0x10) = local_138;
        tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      dVar1 = tcu::Interval::hi((Interval *)this_00);
      puStack_158 = (undefined8 *)local_78;
      do {
        tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4))
        ;
        puVar6 = puStack_158;
        tcu::Interval::Interval((Interval *)&point_hi__1.m_hi);
        tcu::Interval::Interval((Interval *)&point_2);
        local_1a0 = &point_hi__1.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        (*(this->
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ).
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xc])(SUB84(dVar1,0),&point_3,this,ctx);
        pdVar5 = local_1a0;
        local_1a0[2] = (double)local_1a8;
        uVar4 = uStack_1b0;
        *pdVar5 = (double)point_3;
        pdVar5[1] = (double)uVar4;
        local_1c0 = &point_2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        (*(this->
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ).
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xc])(SUB84(dVar1,0),&local_1d8,this,ctx);
        ppIVar3 = local_1c0;
        local_1c0[2] = local_1c8;
        pIVar2 = pIStack_1d0;
        *ppIVar3 = local_1d8;
        ppIVar3[1] = pIVar2;
        tcu::Interval::operator|(&local_1f0,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
        *puVar6 = local_1f0._0_8_;
        puVar6[1] = local_1f0.m_lo;
        puVar6[2] = local_1f0.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode
                  ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      tcu::Interval::operator|
                ((Interval *)&local_208,(Interval *)&val_hi_.m_hi,(Interval *)local_78);
      val_arg_ = local_208;
      ret._0_8_ = local_200;
      ret.m_lo = local_1f8;
    }
    bVar7 = tcu::Interval::hasNaN((Interval *)this_00);
    if (bVar7) {
      fVar9 = std::numeric_limits<float>::quiet_NaN();
      tcu::Interval::Interval(&local_220,(double)fVar9);
      tcu::Interval::operator|=((Interval *)&val_arg_,&local_220);
    }
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(&local_238,this,ctx,ret.m_hi);
  tcu::Interval::operator|=((Interval *)&val_arg_,&local_238);
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(&local_268);
  fVar9 = std::numeric_limits<float>::quiet_NaN();
  tcu::Interval::Interval(&local_280,(double)fVar9);
  tcu::Interval::operator|(&local_250,&local_268,&local_280);
  tcu::Interval::operator&=((Interval *)&val_arg_,&local_250);
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,(Interval *)&val_arg_);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext& ctx, const Interval& iarg0) const
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE1(ret, arg0, iarg0, val,
									 TCU_SET_INTERVAL(val, point,
													  point = this->applyPoint(ctx, arg0)));

		ret |= innerExtrema(ctx, iarg0);
		ret &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(ret);
	}